

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O1

DString * export_to_json(char *source,simple_token *tree,_Bool array_out)

{
  DString *out;
  stack *s;
  
  out = d_string_new("");
  s = stack_new(5);
  if (tree != (simple_token *)0x0) {
    do {
      export_token_to_json(out,tree,source,0,s,array_out);
      tree = tree->next;
    } while (tree != (simple_token *)0x0);
  }
  return out;
}

Assistant:

DString * export_to_json(const char * source, simple_token * tree, bool array_out) {
	DString * out = d_string_new("");
	stack * s = stack_new(5);

	export_token_tree_to_json(out, tree, source, 0, s, array_out);

	return out;
}